

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O1

bool anon_unknown.dwarf_b576ef::InitializeStageSymbolTable
               (TBuiltInParseables *builtInParseables,int version,EProfile profile,
               SpvVersion *spvVersion,EShLanguage language,EShSource source,TInfoSink *infoSink,
               TSymbolTable **commonTable,TSymbolTable **symbolTables)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  
  glslang::TSymbolTable::adoptLevels
            (symbolTables[language],
             commonTable[language == EShLangFragment && profile == EEsProfile]);
  iVar2 = (*builtInParseables->_vptr_TBuiltInParseables[5])(builtInParseables,language);
  bVar1 = InitializeSymbolTable
                    ((TString *)CONCAT44(extraout_var,iVar2),version,profile,spvVersion,language,
                     source,infoSink,symbolTables[language]);
  if (bVar1) {
    (*builtInParseables->_vptr_TBuiltInParseables[6])
              (builtInParseables,version,(ulong)profile,spvVersion,language,symbolTables[language]);
    if (299 < version && profile == EEsProfile) {
      symbolTables[language]->noBuiltInRedeclarations = true;
    }
    if (version == 0x6e) {
      symbolTables[language]->separateNameSpaces = true;
    }
  }
  return bVar1;
}

Assistant:

bool InitializeStageSymbolTable(TBuiltInParseables& builtInParseables, int version, EProfile profile, const SpvVersion& spvVersion,
                                EShLanguage language, EShSource source, TInfoSink& infoSink, TSymbolTable** commonTable,
                                TSymbolTable** symbolTables)
{
    (*symbolTables[language]).adoptLevels(*commonTable[CommonIndex(profile, language)]);
    if (!InitializeSymbolTable(builtInParseables.getStageString(language), version, profile, spvVersion, language, source,
                          infoSink, *symbolTables[language]))
        return false;
    builtInParseables.identifyBuiltIns(version, profile, spvVersion, language, *symbolTables[language]);
    if (profile == EEsProfile && version >= 300)
        (*symbolTables[language]).setNoBuiltInRedeclarations();
    if (version == 110)
        (*symbolTables[language]).setSeparateNameSpaces();

    return true;
}